

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O0

intptr_t fiobj_data_i(FIOBJ o)

{
  FIOBJ o_local;
  
  if (*(uint *)(o + 0x30) < 0xfffffffe) {
    o_local = fiobj_data_get_fd_size(o);
  }
  else {
    o_local = *(FIOBJ *)(o + 0x20);
  }
  return o_local;
}

Assistant:

static intptr_t fiobj_data_i(const FIOBJ o) {
  switch (obj2io(o)->fd) {
  case -1:
  case -2:
    return obj2io(o)->len;
    break;
  default:
    return fiobj_data_get_fd_size(o);
  }
}